

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

TRef crec_ct_tv(jit_State *J,CType *d,TRef dp,TRef sp,cTValue *sval)

{
  ushort uVar1;
  TRef TVar2;
  CTypeID CVar3;
  TRef TVar4;
  CTState *cts_00;
  CType *pCVar5;
  GCcdata *pGVar6;
  uint in_ECX;
  uint *in_RSI;
  jit_State *in_RDI;
  uint *in_R8;
  IRType t;
  CType *cct;
  CTSize ofs;
  GCstr *str;
  TRef tr;
  GCudata *ud;
  CType *s;
  void *svisnz;
  CTypeID sid;
  CTState *cts;
  CType *ct;
  undefined4 in_stack_fffffffffffffd18;
  TraceError in_stack_fffffffffffffd1c;
  jit_State *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined2 in_stack_fffffffffffffd2c;
  IRRef1 in_stack_fffffffffffffd2e;
  IRRef1 IVar7;
  cTValue *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined2 in_stack_fffffffffffffd3c;
  undefined2 in_stack_fffffffffffffd3e;
  jit_State *in_stack_fffffffffffffd40;
  undefined6 in_stack_fffffffffffffd48;
  undefined2 in_stack_fffffffffffffd4e;
  IRType local_294;
  CType *local_268;
  IRRef1 local_240;
  CType *local_228;
  CType *local_210;
  jit_State *in_stack_fffffffffffffe08;
  TRef in_stack_fffffffffffffe10;
  TRef in_stack_fffffffffffffe14;
  jit_State *in_stack_fffffffffffffe18;
  undefined2 in_stack_fffffffffffffe20;
  undefined2 in_stack_fffffffffffffe22;
  IRRef1 in_stack_fffffffffffffe24;
  ushort in_stack_fffffffffffffe26;
  jit_State *in_stack_fffffffffffffe28;
  
  cts_00 = (CTState *)(ulong)in_RDI[-1].bpropcache[0xc].mode;
  if ((4 < (in_ECX >> 0x18 & 0x1f) - 0xf) && ((in_ECX & 0x1f000000) != 0xe000000)) {
    if ((in_ECX >> 0x18 & 0x1f) - 1 < 2) {
      lj_ir_kint((jit_State *)&in_stack_fffffffffffffd30->field_2,
                 CONCAT22(in_stack_fffffffffffffd2e,in_stack_fffffffffffffd2c));
    }
    else if ((in_ECX & 0x1f000000) == 0) {
      lj_ir_kptr_(in_stack_fffffffffffffd40,
                  CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c),
                  in_stack_fffffffffffffd30);
    }
    else {
      IVar7 = (IRRef1)in_ECX;
      if ((in_ECX & 0x1f000000) == 0xc000000) {
        if (*(char *)((ulong)*in_R8 + 6) == '\x01') {
          (in_RDI->fold).ins.field_0.ot = 0x4410;
          (in_RDI->fold).ins.field_0.op1 = IVar7;
          (in_RDI->fold).ins.field_0.op2 = 0xc;
          TVar4 = lj_opt_fold((jit_State *)
                              CONCAT26(in_stack_fffffffffffffd2e,
                                       CONCAT24(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                                      ));
          TVar2 = lj_ir_kint((jit_State *)&in_stack_fffffffffffffd30->field_2,
                             CONCAT22(in_stack_fffffffffffffd2e,in_stack_fffffffffffffd2c));
          (in_RDI->fold).ins.field_0.ot = 0x893;
          (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar4;
          (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar2;
          lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_fffffffffffffd2e,
                               CONCAT24(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)));
          (in_RDI->fold).ins.field_0.ot = 0x4409;
          (in_RDI->fold).ins.field_0.op1 = IVar7;
          (in_RDI->fold).ins.field_0.op2 = 0xd;
          lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_fffffffffffffd2e,
                               CONCAT24(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)));
        }
        else {
          TVar4 = lj_ir_kint64(in_stack_fffffffffffffd20,
                               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
          (in_RDI->fold).ins.field_0.ot = 0x2909;
          (in_RDI->fold).ins.field_0.op1 = IVar7;
          (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
          lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_fffffffffffffd2e,
                               CONCAT24(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)));
        }
      }
      else if ((in_ECX & 0x1f000000) == 0x4000000) {
        if (*in_RSI >> 0x1c == 5) {
          pCVar5 = lj_ctype_getfieldq((CTState *)
                                      CONCAT26(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48),
                                      (CType *)in_stack_fffffffffffffd40,
                                      (GCstr *)CONCAT26(in_stack_fffffffffffffd3e,
                                                        CONCAT24(in_stack_fffffffffffffd3c,
                                                                 in_stack_fffffffffffffd38)),
                                      (CTSize *)&in_stack_fffffffffffffd30->u64,
                                      (CTInfo *)
                                      CONCAT26(in_stack_fffffffffffffd2e,
                                               CONCAT24(in_stack_fffffffffffffd2c,
                                                        in_stack_fffffffffffffd28)));
          TVar4 = lj_ir_kgc(in_RDI,(GCobj *)CONCAT26(in_stack_fffffffffffffd3e,
                                                     CONCAT24(in_stack_fffffffffffffd3c,
                                                              in_stack_fffffffffffffd38)),
                            (IRType)((ulong)in_stack_fffffffffffffd30 >> 0x20));
          (in_RDI->fold).ins.field_0.ot = 0x884;
          (in_RDI->fold).ins.field_0.op1 = IVar7;
          (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
          lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_fffffffffffffd2e,
                               CONCAT24(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)));
          if ((pCVar5 != (CType *)0x0) && (pCVar5->info >> 0x1c == 0xb)) {
            lj_ir_kint((jit_State *)&in_stack_fffffffffffffd30->field_2,
                       CONCAT22(in_stack_fffffffffffffd2e,in_stack_fffffffffffffd2c));
          }
        }
        else {
          if ((*in_RSI & 0xfc000000) == 0x30000000) {
            lj_trace_err(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
          }
          TVar4 = lj_ir_kint64(in_stack_fffffffffffffd20,
                               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
          (in_RDI->fold).ins.field_0.ot = 0x2909;
          (in_RDI->fold).ins.field_0.op1 = IVar7;
          (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
          lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_fffffffffffffd2e,
                               CONCAT24(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)));
        }
      }
      else {
        if ((in_ECX & 0x1f000000) == 0x3000000) {
          lj_trace_err(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
        }
        pGVar6 = argv2cdata(in_stack_fffffffffffffd40,
                            CONCAT22(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c),
                            in_stack_fffffffffffffd30);
        for (local_228 = cts_00->tab + pGVar6->ctypeid; local_228->info >> 0x1c == 8;
            local_228 = cts_00->tab + (local_228->info & 0xffff)) {
        }
        local_268 = local_228;
        if (local_228->info >> 0x1c == 6) {
          CVar3 = lj_ctype_intern((CTState *)
                                  CONCAT26(in_stack_fffffffffffffd2e,
                                           CONCAT24(in_stack_fffffffffffffd2c,
                                                    in_stack_fffffffffffffd28)),
                                  (CTInfo)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                                  (CTSize)in_stack_fffffffffffffd20);
          local_268 = cts_00->tab + CVar3;
          local_294 = IRT_P64;
        }
        else {
          local_294 = crec_ct2irt(cts_00,local_228);
        }
        uVar1 = (ushort)local_294;
        if (local_268->info >> 0x1c == 2) {
          (in_RDI->fold).ins.field_0.ot = uVar1 | 0x4400;
          (in_RDI->fold).ins.field_0.op1 = IVar7;
          (in_RDI->fold).ins.field_0.op2 = 0xf;
          TVar4 = lj_opt_fold((jit_State *)
                              CONCAT26(in_stack_fffffffffffffd2e,
                                       CONCAT24(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                                      ));
          local_240 = (IRRef1)TVar4;
          if ((local_268->info & 0xf0800000) != 0x20800000) goto LAB_001b7fcd;
          local_210 = local_268;
          do {
            local_268 = cts_00->tab + (local_210->info & 0xffff);
            local_210 = local_268;
          } while (local_268->info >> 0x1c == 8);
          if (local_268->info >> 0x1c == 5) {
            local_268 = cts_00->tab + (local_268->info & 0xffff);
          }
          local_294 = crec_ct2irt(cts_00,local_268);
          IVar7 = in_stack_fffffffffffffd2e;
        }
        else {
          if ((local_294 == IRT_I64) || (local_294 == IRT_U64)) {
            (in_RDI->fold).ins.field_0.ot = uVar1 | 0x4400;
            (in_RDI->fold).ins.field_0.op1 = IVar7;
            (in_RDI->fold).ins.field_0.op2 = 0x11;
            lj_opt_fold((jit_State *)
                        CONCAT26(in_stack_fffffffffffffd2e,
                                 CONCAT24(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)));
            goto LAB_001b7fcd;
          }
          if ((local_294 == IRT_IGC) || (local_294 == IRT_U32)) {
            in_stack_fffffffffffffe26 = uVar1 | 0x4400;
            in_stack_fffffffffffffe22 = 0x10;
            (in_RDI->fold).ins.field_0.ot = in_stack_fffffffffffffe26;
            (in_RDI->fold).ins.field_0.op1 = IVar7;
            (in_RDI->fold).ins.field_0.op2 = 0x10;
            lj_opt_fold((jit_State *)
                        CONCAT26(in_stack_fffffffffffffd2e,
                                 CONCAT24(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)));
            in_stack_fffffffffffffe24 = IVar7;
            in_stack_fffffffffffffe28 = in_RDI;
            goto LAB_001b7fcd;
          }
          in_stack_fffffffffffffe18 = in_RDI;
          TVar4 = lj_ir_kint64(in_RDI,CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18))
          ;
          in_stack_fffffffffffffe14 = CONCAT22(0x2909,IVar7);
          in_stack_fffffffffffffe10 = CONCAT22((IRRef1)TVar4,(short)in_stack_fffffffffffffe10);
          (in_stack_fffffffffffffe18->fold).ins.field_0.ot = 0x2909;
          (in_stack_fffffffffffffe18->fold).ins.field_0.op1 = IVar7;
          (in_stack_fffffffffffffe18->fold).ins.field_0.op2 = (IRRef1)TVar4;
          TVar4 = lj_opt_fold((jit_State *)
                              CONCAT26(IVar7,CONCAT24(in_stack_fffffffffffffd2c,
                                                      in_stack_fffffffffffffd28)));
          local_240 = (IRRef1)TVar4;
        }
        if ((local_268->info >> 0x1c == 0) && (local_294 != IRT_CDATA)) {
          (in_RDI->fold).ins.field_0.ot = (ushort)local_294 | 0x4500;
          (in_RDI->fold).ins.field_0.op1 = local_240;
          (in_RDI->fold).ins.field_0.op2 = 0;
          lj_opt_fold((jit_State *)
                      CONCAT26(IVar7,CONCAT24(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)))
          ;
          in_stack_fffffffffffffe08 = in_RDI;
        }
      }
    }
  }
LAB_001b7fcd:
  TVar4 = crec_ct_ct(in_stack_fffffffffffffe28,
                     (CType *)CONCAT26(in_stack_fffffffffffffe26,
                                       CONCAT24(in_stack_fffffffffffffe24,
                                                CONCAT22(in_stack_fffffffffffffe22,
                                                         in_stack_fffffffffffffe20))),
                     (CType *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                     in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  return TVar4;
}

Assistant:

static TRef crec_ct_tv(jit_State *J, CType *d, TRef dp, TRef sp, cTValue *sval)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID sid = CTID_P_VOID;
  void *svisnz = 0;
  CType *s;
  if (LJ_LIKELY(tref_isinteger(sp))) {
    sid = CTID_INT32;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isnum(sp)) {
    sid = CTID_DOUBLE;
    svisnz = (void *)(intptr_t)(tvisint(sval)?(intV(sval)!=0):!tviszero(sval));
  } else if (tref_isbool(sp)) {
    sp = lj_ir_kint(J, tref_istrue(sp) ? 1 : 0);
    sid = CTID_BOOL;
  } else if (tref_isnil(sp)) {
    sp = lj_ir_kptr(J, NULL);
  } else if (tref_isudata(sp)) {
    GCudata *ud = udataV(sval);
    if (ud->udtype == UDTYPE_IO_FILE) {
      TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), sp, IRFL_UDATA_UDTYPE);
      emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, UDTYPE_IO_FILE));
      sp = emitir(IRT(IR_FLOAD, IRT_PTR), sp, IRFL_UDATA_FILE);
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCudata)));
    }
  } else if (tref_isstr(sp)) {
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      GCstr *str = strV(sval);
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      /* Specialize to the name of the enum constant. */
      emitir(IRTG(IR_EQ, IRT_STR), sp, lj_ir_kstr(J, str));
      if (cct && ctype_isconstval(cct->info)) {
	lj_assertJ(ctype_child(cts, cct)->size == 4,
		   "only 32 bit const supported");  /* NYI */
	svisnz = (void *)(intptr_t)(ofs != 0);
	sp = lj_ir_kint(J, (int32_t)ofs);
	sid = ctype_cid(cct->info);
      }  /* else: interpreter will throw. */
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);  /* NYI */
    } else {  /* Otherwise pass the string data as a const char[]. */
      /* Don't use STRREF. It folds with SNEW, which loses the trailing NUL. */
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCstr)));
      sid = CTID_A_CCHAR;
    }
  } else if (tref_islightud(sp)) {
#if LJ_64
    lj_trace_err(J, LJ_TRERR_NYICONV);
#endif
  } else {  /* NYI: tref_istab(sp). */
    IRType t;
    sid = argv2cdata(J, sp, sval)->ctypeid;
    s = ctype_raw(cts, sid);
    svisnz = cdataptr(cdataV(sval));
    if (ctype_isfunc(s->info)) {
      sid = lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|sid), CTSIZE_PTR);
      s = ctype_get(cts, sid);
      t = IRT_PTR;
    } else {
      t = crec_ct2irt(cts, s);
    }
    if (ctype_isptr(s->info)) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_PTR);
      if (ctype_isref(s->info)) {
	svisnz = *(void **)svisnz;
	s = ctype_rawchild(cts, s);
	if (ctype_isenum(s->info)) s = ctype_child(cts, s);
	t = crec_ct2irt(cts, s);
      } else {
	goto doconv;
      }
    } else if (t == IRT_I64 || t == IRT_U64) {
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT64);
      lj_needsplit(J);
      goto doconv;
    } else if (t == IRT_INT || t == IRT_U32) {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      sp = emitir(IRT(IR_FLOAD, t), sp, IRFL_CDATA_INT);
      goto doconv;
    } else {
      sp = emitir(IRT(IR_ADD, IRT_PTR), sp, lj_ir_kintp(J, sizeof(GCcdata)));
    }
    if (ctype_isnum(s->info) && t != IRT_CDATA)
      sp = emitir(IRT(IR_XLOAD, t), sp, 0);  /* Load number value. */
    goto doconv;
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  return crec_ct_ct(J, d, s, dp, sp, svisnz);
}